

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_computeDivergence
               (MultiFab *divu,Array<const_MultiFab_*,_3> *umac,Geometry *geom,
               bool already_on_centroids,MultiFab *vel_eb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  EBCellFlagFab *this;
  EBCellFlag *pEVar5;
  long lVar6;
  FabType FVar7;
  EBFArrayBoxFactory *this_00;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint32_t *puVar18;
  uint32_t *puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  MFIter mfi;
  long local_2b8;
  Box local_2ac;
  MultiCutFab *local_290;
  MultiCutFab *local_288;
  FabArray<amrex::FArrayBox> *local_280;
  Geometry *local_278;
  FabArray<amrex::FArrayBox> *local_270;
  Real local_268;
  FabArray<amrex::EBCellFlagFab> *local_260;
  uint32_t *local_258;
  ulong local_250;
  long local_248;
  ulong local_240;
  long local_238;
  long local_230;
  long local_228;
  uint32_t *local_220;
  FabArray<amrex::FArrayBox> *local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  Array4<const_double> local_1e8;
  Array4<const_double> local_1a8;
  Array4<double> local_168;
  Array4<const_double> local_128;
  Array4<const_double> local_e8;
  MFIter local_a8;
  MFItInfo local_44;
  
  local_278 = geom;
  local_270 = &vel_eb->super_FabArray<amrex::FArrayBox>;
  EB_computeDivergence(divu,umac,geom,already_on_centroids);
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((divu->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if (this_00 != (EBFArrayBoxFactory *)0x0) {
    local_260 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    local_280 = &EBFArrayBoxFactory::getVolFrac(this_00)->super_FabArray<amrex::FArrayBox>;
    local_288 = EBFArrayBoxFactory::getBndryNormal(this_00);
    local_290 = EBFArrayBoxFactory::getBndryArea(this_00);
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.do_tiling = true;
    local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_44.tilesize.vect[2] = DAT_007d7ef0;
    local_44.dynamic = true;
    local_44.device_sync = true;
    MFIter::MFIter(&local_a8,(FabArrayBase *)divu,&local_44);
    local_218 = &divu->super_FabArray<amrex::FArrayBox>;
    while (local_a8.currentIndex < local_a8.endIndex) {
      MFIter::tilebox(&local_2ac,&local_a8);
      piVar8 = &local_a8.currentIndex;
      if (local_a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar8 = ((local_a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_a8.currentIndex;
      }
      this = (local_260->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar8];
      FVar7 = EBCellFlagFab::getType(this,&local_2ac);
      if (FVar7 == singlevalued) {
        local_268 = (local_278->super_CoordSys).inv_dx[0];
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_168,&divu->super_FabArray<amrex::FArrayBox>,&local_a8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_1a8,local_270,&local_a8)
        ;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_e8,local_280,&local_a8);
        MultiCutFab::const_array(&local_1e8,local_288,&local_a8);
        pEVar5 = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
        iVar1 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
        iVar2 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
        iVar3 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        lVar12 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar1) + 1
                       );
        lVar20 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar2) + 1
                       );
        MultiCutFab::const_array(&local_128,local_290,&local_a8);
        lVar9 = (long)local_2ac.smallend.vect[0];
        local_228 = (long)local_2ac.smallend.vect[1];
        local_248 = (long)local_2ac.smallend.vect[2];
        uVar4 = (divu->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        local_250 = (ulong)uVar4;
        local_208 = (long)local_2ac.bigend.vect[1];
        local_230 = (long)local_2ac.bigend.vect[2];
        local_258 = (uint32_t *)
                    ((long)&pEVar5[lVar9 - iVar1].flag +
                    (local_228 * 4 + (local_248 - iVar3) * lVar20 * 4 + (long)iVar2 * -4) * lVar12);
        lVar20 = lVar20 * lVar12;
        local_238 = lVar20 * 4;
        local_210 = lVar12 * 4;
        local_2b8 = 0;
        local_240 = 0;
        while( true ) {
          lVar14 = local_248;
          puVar18 = local_258;
          if (local_240 == local_250) break;
          while( true ) {
            puVar19 = puVar18;
            lVar21 = local_228;
            if (local_230 < lVar14) break;
            for (; lVar21 <= local_208; lVar21 = lVar21 + 1) {
              lVar10 = (long)local_1a8.begin.x;
              lVar13 = (long)local_1e8.begin.x;
              lVar22 = (lVar14 - local_1a8.begin.z) * local_1a8.kstride;
              lVar15 = (lVar21 - local_1a8.begin.y) * local_1a8.jstride;
              lVar16 = (lVar14 - local_1e8.begin.z) * local_1e8.kstride;
              lVar11 = (lVar21 - local_1e8.begin.y) * local_1e8.jstride;
              local_1f0 = (long)local_128.begin.y;
              local_1f8 = (long)local_e8.begin.y;
              lVar6 = local_168.nstride * local_2b8 +
                      (lVar21 - local_168.begin.y) * local_168.jstride * 8 +
                      (lVar14 - local_168.begin.z) * local_168.kstride * 8 +
                      (long)local_168.begin.x * -8 + lVar9 * 8;
              for (lVar17 = 0; lVar9 + lVar17 <= (long)local_2ac.bigend.vect[0]; lVar17 = lVar17 + 1
                  ) {
                if ((puVar19[lVar17] & 3) == 1) {
                  *(double *)((long)local_168.p + lVar17 * 8 + lVar6) =
                       ((local_1a8.p
                         [lVar9 + ((lVar22 + lVar15 + local_1a8.nstride * 2 + lVar17) - lVar10)] *
                         local_1e8.p
                         [lVar9 + ((lVar16 + lVar11 + local_1e8.nstride * 2 + lVar17) - lVar13)] +
                        local_1a8.p[lVar9 + ((lVar22 + lVar15 + lVar17) - lVar10)] *
                        local_1e8.p[lVar9 + ((lVar16 + lVar11 + lVar17) - lVar13)] +
                        local_1a8.p
                        [lVar9 + ((local_1a8.nstride + lVar22 + lVar15 + lVar17) - lVar10)] *
                        local_1e8.p
                        [lVar9 + ((lVar16 + lVar11 + local_1e8.nstride + lVar17) - lVar13)]) *
                        local_128.p
                        [lVar9 + (((lVar14 - local_128.begin.z) * local_128.kstride +
                                  (lVar21 - local_1f0) * local_128.jstride + lVar17) -
                                 (long)local_128.begin.x)] * local_268) /
                       local_e8.p
                       [lVar9 + (((lVar14 - local_e8.begin.z) * local_e8.kstride +
                                 (lVar21 - local_1f8) * local_e8.jstride + lVar17) -
                                (long)local_e8.begin.x)] +
                       *(double *)((long)local_168.p + lVar17 * 8 + lVar6);
                }
              }
              puVar19 = puVar19 + lVar12;
              divu = (MultiFab *)local_218;
            }
            lVar14 = lVar14 + 1;
            puVar18 = puVar18 + lVar20;
          }
          local_240 = local_240 + 1;
          local_2b8 = local_2b8 + 8;
          local_220 = puVar18;
          local_200 = lVar14;
        }
      }
      MFIter::operator++(&local_a8);
    }
    MFIter::~MFIter(&local_a8);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void EB_computeDivergence (MultiFab& divu, const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                           const Geometry& geom, bool already_on_centroids,
                           const MultiFab& vel_eb)
{
    AMREX_ASSERT(divu.hasEBFabFactory());

    EB_computeDivergence(divu, umac, geom, already_on_centroids);

    // Add EB flow contribution
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(divu.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& vfrac = factory.getVolFrac();
    const auto& bnorm = factory.getBndryNormal();
    const auto& barea = factory.getBndryArea();

    MFItInfo info;
    if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(divu,info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        const auto& flagfab = flags[mfi];

        if (flagfab.getType(bx) == FabType::singlevalued) {
            const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

            Array4<Real> const& divuarr = divu.array(mfi);
            Array4<Real const> const& vel_eb_arr = vel_eb.const_array(mfi);
            Array4<Real const> const& vfracarr = vfrac.const_array(mfi);
            Array4<Real const> const& bnormarr = bnorm.const_array(mfi);
            Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
            Array4<Real const> const& bareaarr = barea.const_array(mfi);

            AMREX_HOST_DEVICE_FOR_4D(bx,divu.nComp(),i,j,k,n,
            {
                eb_add_divergence_from_flow(i,j,k,n,divuarr,vel_eb_arr,
                    flagarr,vfracarr,bnormarr,bareaarr,dxinv);
            });
        }
    }
}